

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int sweepstep(lua_State *L,global_State *g,int nextstate,GCObject **nextlist)

{
  GCObject **ppGVar1;
  int local_3c;
  l_mem lStack_38;
  int count;
  l_mem olddebt;
  GCObject **nextlist_local;
  global_State *pgStack_20;
  int nextstate_local;
  global_State *g_local;
  lua_State *L_local;
  
  if (g->sweepgc == (GCObject **)0x0) {
    g->gcstate = (lu_byte)nextstate;
    g->sweepgc = nextlist;
    L_local._4_4_ = 0;
  }
  else {
    lStack_38 = g->GCdebt;
    olddebt = (l_mem)nextlist;
    nextlist_local._4_4_ = nextstate;
    pgStack_20 = g;
    g_local = (global_State *)L;
    ppGVar1 = sweeplist(L,g->sweepgc,100,&local_3c);
    pgStack_20->sweepgc = ppGVar1;
    pgStack_20->GCestimate = (pgStack_20->GCdebt - lStack_38) + pgStack_20->GCestimate;
    L_local._4_4_ = local_3c;
  }
  return L_local._4_4_;
}

Assistant:

static int sweepstep (lua_State *L, global_State *g,
                      int nextstate, GCObject **nextlist) {
  if (g->sweepgc) {
    l_mem olddebt = g->GCdebt;
    int count;
    g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX, &count);
    g->GCestimate += g->GCdebt - olddebt;  /* update estimate */
    return count;
  }
  else {  /* enter next state */
    g->gcstate = nextstate;
    g->sweepgc = nextlist;
    return 0;  /* no work done */
  }
}